

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcUif.c
# Opt level: O3

Vec_Int_t * Wlc_NtkCollectAddMult(Wlc_Ntk_t *p,Wlc_BstPar_t *pPar,int *pCountA,int *pCountM)

{
  Wlc_Obj_t *pWVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  
  *pCountM = 0;
  *pCountA = 0;
  if ((pPar->nAdderLimit != 0) || (pPar->nMultLimit != 0)) {
    p_00 = (Vec_Int_t *)malloc(0x10);
    p_00->nCap = 100;
    p_00->nSize = 0;
    piVar3 = (int *)malloc(400);
    p_00->pArray = piVar3;
    if (1 < p->iObj) {
      lVar7 = 1;
      lVar8 = 0x24;
      do {
        if (p->nObjsAlloc <= lVar7) {
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                        ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
        pWVar1 = p->pObjs;
        uVar4 = *(ushort *)((long)pWVar1 + lVar8 + -0xc) & 0x3f;
        if (uVar4 == 0x2d) {
          iVar5 = pPar->nMultLimit;
          if (iVar5 != 0) {
            iVar6 = *(int *)((long)pWVar1 + lVar8 + -4) - *(int *)(&pWVar1->field_0x0 + lVar8);
            piVar3 = pCountM;
            iVar2 = -iVar6;
            if (0 < iVar6) {
              iVar2 = iVar6;
            }
            goto LAB_0037b9e8;
          }
        }
        else if ((uVar4 == 0x2b) && (iVar5 = pPar->nAdderLimit, iVar5 != 0)) {
          iVar6 = *(int *)((long)pWVar1 + lVar8 + -4) - *(int *)(&pWVar1->field_0x0 + lVar8);
          piVar3 = pCountA;
          iVar2 = -iVar6;
          if (0 < iVar6) {
            iVar2 = iVar6;
          }
LAB_0037b9e8:
          if (iVar5 <= iVar2 + 1) {
            Vec_IntPush(p_00,(int)lVar7);
            *piVar3 = *piVar3 + 1;
          }
        }
        lVar7 = lVar7 + 1;
        lVar8 = lVar8 + 0x18;
      } while (lVar7 < p->iObj);
      if (0 < p_00->nSize) {
        Wlc_NtkCollectBoxes(p,p_00);
        return p_00;
      }
      piVar3 = p_00->pArray;
    }
    if (piVar3 != (int *)0x0) {
      free(piVar3);
    }
    free(p_00);
  }
  return (Vec_Int_t *)0x0;
}

Assistant:

Vec_Int_t * Wlc_NtkCollectAddMult( Wlc_Ntk_t * p, Wlc_BstPar_t * pPar, int * pCountA, int * pCountM )
{
    Vec_Int_t * vBoxIds;
    Wlc_Obj_t * pObj;  int i;
    *pCountA = *pCountM = 0;
    if ( pPar->nAdderLimit == 0 && pPar->nMultLimit == 0 )
        return NULL;
    vBoxIds = Vec_IntAlloc( 100 );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( pObj->Type == WLC_OBJ_ARI_ADD && pPar->nAdderLimit && Wlc_ObjRange(pObj) >= pPar->nAdderLimit )
            Vec_IntPush( vBoxIds, i ), (*pCountA)++;
        else if ( pObj->Type == WLC_OBJ_ARI_MULTI && pPar->nMultLimit && Wlc_ObjRange(pObj) >= pPar->nMultLimit )
            Vec_IntPush( vBoxIds, i ), (*pCountM)++;
    }
    if ( Vec_IntSize( vBoxIds ) > 0 )
    {
        Wlc_NtkCollectBoxes( p, vBoxIds );
        return vBoxIds;
    }
    Vec_IntFree( vBoxIds );
    return NULL;
}